

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBoxAlgo.cpp
# Opt level: O0

Box3f * anon_unknown.dwarf_28a62::transformSimple(Box3f *b,M44f *M)

{
  float *pfVar1;
  Vec3<float> *in_RDX;
  Box<Imath_2_5::Vec3<float>_> *in_RSI;
  Box3f *in_RDI;
  Matrix44<float> *in_stack_00000020;
  Vec3<float> *in_stack_00000028;
  int j;
  V3f p;
  int i;
  Box3f *b1;
  undefined4 in_stack_ffffffffffffffb0;
  float fVar2;
  undefined4 in_stack_ffffffffffffffb4;
  int local_2c;
  Vec3<float> local_28;
  int local_1c;
  
  Imath_2_5::Box<Imath_2_5::Vec3<float>_>::Box
            ((Box<Imath_2_5::Vec3<float>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    Imath_2_5::Vec3<float>::Vec3(&local_28);
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      if ((local_1c >> ((byte)local_2c & 0x1f) & 1U) == 0) {
        pfVar1 = Imath_2_5::Vec3<float>::operator[](&in_RSI->min,local_2c);
        fVar2 = *pfVar1;
      }
      else {
        pfVar1 = Imath_2_5::Vec3<float>::operator[](&in_RSI->max,local_2c);
        fVar2 = *pfVar1;
      }
      pfVar1 = Imath_2_5::Vec3<float>::operator[](&local_28,local_2c);
      *pfVar1 = fVar2;
    }
    Imath_2_5::operator*(in_stack_00000028,in_stack_00000020);
    Imath_2_5::Box<Imath_2_5::Vec3<float>_>::extendBy(in_RSI,in_RDX);
  }
  return in_RDI;
}

Assistant:

Box3f
transformSimple (const Box3f &b, const M44f &M)
{
    Box3f b1;

    for (int i = 0; i < 8; ++i)
    {
	V3f p;

	for (int j = 0; j < 3; ++j)
	    p[j] = ((i >> j) & 1)? b.max[j]: b.min[j];

	b1.extendBy (p * M);
    }

    return b1;
}